

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.cpp
# Opt level: O1

float __thiscall
Rml::Box::GetSizeAcross(Box *this,BoxDirection direction,BoxArea area_outer,BoxArea area_inner)

{
  code *pcVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  float (*pafVar5) [4];
  float fVar6;
  
  if (((area_inner == Auto) || (1 < (int)direction)) || ((int)area_inner < (int)area_outer)) {
    bVar2 = Assert("RMLUI_ASSERT((int)area_outer <= (int)area_inner && (int)direction <= 1 && area_inner != BoxArea::Auto)"
                   ,
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Box.cpp"
                   ,0x65);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  fVar6 = 0.0;
  if (area_inner == Content) {
    fVar6 = *(float *)((long)(this->area_edges + -1) + 8 + (ulong)(direction != Horizontal) * 4);
  }
  if ((int)area_outer < 3 && (int)area_outer <= (int)area_inner) {
    lVar3 = 2;
    if ((long)(int)area_inner < 2) {
      lVar3 = (long)(int)area_inner;
    }
    lVar4 = (long)(int)area_outer + -1;
    pafVar5 = this->area_edges + (int)area_outer;
    do {
      fVar6 = fVar6 + (*pafVar5)[(int)direction] + (*pafVar5)[(int)(direction + 2)];
      lVar4 = lVar4 + 1;
      pafVar5 = pafVar5 + 1;
    } while (lVar4 < lVar3);
  }
  return fVar6;
}

Assistant:

float Box::GetSizeAcross(BoxDirection direction, BoxArea area_outer, BoxArea area_inner) const
{
	static_assert((int)BoxDirection::Horizontal == 1 && (int)BoxDirection::Vertical == 0, "");
	RMLUI_ASSERT((int)area_outer <= (int)area_inner && (int)direction <= 1 && area_inner != BoxArea::Auto);

	float size = 0.0f;

	if (area_inner == BoxArea::Content)
		size = (direction == BoxDirection::Horizontal ? content.x : content.y);

	for (int i = (int)area_outer; i <= (int)area_inner && i < (int)BoxArea::Content; i++)
		size += (area_edges[i][(int)BoxEdge::Top + (int)direction] + area_edges[i][(int)BoxEdge::Bottom + (int)direction]);

	return size;
}